

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::find_child_by_attribute
          (xml_node *this,char_t *name_,char_t *attr_name,char_t *attr_value)

{
  bool bVar1;
  long *in_RDI;
  xml_attribute_struct *a;
  xml_node_struct *i;
  char_t *in_stack_ffffffffffffffa8;
  char_t *in_stack_ffffffffffffffb0;
  xml_attribute_struct *local_38;
  xml_node_struct *local_30;
  xml_node local_8;
  
  if (*in_RDI == 0) {
    xml_node(&local_8);
  }
  else {
    for (local_30 = *(xml_node_struct **)(*in_RDI + 0x20); local_30 != (xml_node_struct *)0x0;
        local_30 = local_30->next_sibling) {
      if ((local_30->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), bVar1)) {
        for (local_38 = local_30->first_attribute; local_38 != (xml_attribute_struct *)0x0;
            local_38 = local_38->next_attribute) {
          if ((local_38->name != (char_t *)0x0) &&
             (bVar1 = impl::anon_unknown_0::strequal
                                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), bVar1)) {
            if (local_38->value == (char_t *)0x0) {
              in_stack_ffffffffffffffb0 = "";
            }
            else {
              in_stack_ffffffffffffffb0 = local_38->value;
            }
            bVar1 = impl::anon_unknown_0::strequal
                              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            if (bVar1) {
              xml_node(&local_8,local_30);
              return (xml_node)local_8._root;
            }
          }
        }
      }
    }
    xml_node(&local_8);
  }
  return (xml_node)local_8._root;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* name_, const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (i->name && impl::strequal(name_, i->name))
			{
				for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
					if (a->name && impl::strequal(attr_name, a->name) && impl::strequal(attr_value, a->value ? a->value + 0 : PUGIXML_TEXT("")))
						return xml_node(i);
			}

		return xml_node();
	}